

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O2

KDop<16U> * __thiscall NBvh3::KDop<16U>::operator+=(KDop<16U> *this,SVertex *vertex)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint i;
  long lVar4;
  float local_28 [10];
  
  local_28[2] = vertex->z;
  uVar2 = vertex->x;
  uVar3 = vertex->y;
  local_28[0] = (float)uVar2;
  local_28[1] = (float)uVar3;
  local_28[3] = (float)uVar2 + (float)uVar3;
  local_28[4] = local_28[2] + (float)uVar2;
  local_28[5] = local_28[2] + (float)uVar3;
  local_28[6] = (float)uVar2 - (float)uVar3;
  local_28[7] = (float)uVar2 - local_28[2];
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    fVar1 = local_28[lVar4];
    if (this->mMax[lVar4] <= fVar1 && fVar1 != this->mMax[lVar4]) {
      this->mMax[lVar4] = fVar1;
    }
    if (fVar1 < this->mMin[lVar4]) {
      this->mMin[lVar4] = fVar1;
    }
  }
  return this;
}

Assistant:

KDop<K>& KDop<K>::operator += (const SVertex& vertex)
{
    float dists[K / 2];
    getDistances<K / 2>(vertex, dists);
    for(unsigned i = 0; i < K / 2; ++i)
    {
        setMinMax(dists[i], mMin[i], mMax[i]);
    }

    return *this;
}